

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void tbl_DrawNextCard(void)

{
  Card_t card_00;
  Card_t card_01;
  _Bool _Var1;
  undefined1 local_14 [8];
  Card_t card;
  
  _Var1 = stk_Pop(&PackStack,(Card_t *)local_14);
  if (_Var1) {
    stk_TurnTopCardDown(&RestStack);
    card.m_type = CT_ACE;
    card_01.m_face = CF_UP;
    card_01.m_type = local_14._0_4_;
    card_01.m_color = local_14._4_4_;
    stk_PushCopy(&RestStack,card_01);
  }
  else {
    while (_Var1 = stk_Pop(&RestStack,(Card_t *)local_14), _Var1) {
      card.m_type = CT_NONE;
      card_00.m_face = CF_DOWN;
      card_00.m_type = local_14._0_4_;
      card_00.m_color = local_14._4_4_;
      stk_PushCopy(&PackStack,card_00);
      UpdateScore(-2);
    }
  }
  return;
}

Assistant:

void tbl_DrawNextCard(void)
{
  Card_t card;
  if (stk_Pop(&PackStack, &card)) {
    stk_TurnTopCardDown(&RestStack);
    card.m_face = CF_UP;
    stk_PushCopy(&RestStack, card);
  } else {
    while (stk_Pop(&RestStack, &card)) {
      card.m_face = CF_DOWN;
      stk_PushCopy(&PackStack, card);
      UpdateScore(-2);
    }
  }
}